

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void * fio_malloc(size_t size)

{
  fio_lock_i fVar1;
  void *pvVar2;
  arena_s *paVar3;
  block_s *blk;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  block_s *pbVar7;
  ushort uVar8;
  long lVar9;
  arena_s *unaff_R15;
  arena_s *paVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  fio_lock_i ret;
  timespec local_38;
  
  if (size == 0) {
    return &on_malloc_zero;
  }
  if (0x3fff < size) {
    pvVar2 = big_alloc(size);
    return pvVar2;
  }
  lVar9 = ((size >> 4) + 1) - (ulong)((size & 0xf) == 0);
  paVar3 = *(arena_s **)(in_FS_OFFSET + -0x2b0);
  if (*(arena_s **)(in_FS_OFFSET + -0x2b0) == (arena_s *)0x0) {
    paVar3 = arenas;
  }
  LOCK();
  fVar1 = paVar3->lock;
  paVar3->lock = '\x01';
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
  paVar10 = paVar3;
  if (fVar1 != '\0') {
    do {
      paVar10 = unaff_R15;
      uVar5 = (long)paVar3 - (long)arenas >> 4;
      bVar11 = uVar5 < memory.cores;
      if (bVar11) {
        lVar6 = 0;
        do {
          if (paVar3 == arenas || lVar6 != 0) {
            LOCK();
            fVar1 = (&paVar3->lock)[lVar6];
            (&paVar3->lock)[lVar6] = '\x01';
            UNLOCK();
            local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
            if (fVar1 == '\0') {
              paVar10 = (arena_s *)((long)&paVar3->block + lVar6);
              break;
            }
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x10;
          bVar11 = uVar5 < memory.cores;
        } while (bVar11);
      }
      if ((!bVar11) && (bVar12 = paVar3 == arenas, paVar3 = arenas, bVar12)) {
        local_38.tv_sec = 0;
        local_38.tv_nsec = 1;
        nanosleep(&local_38,(timespec *)0x0);
        paVar3 = arenas;
      }
      unaff_R15 = paVar10;
    } while (!bVar11);
  }
  *(arena_s **)(in_FS_OFFSET + -0x2b0) = paVar10;
  blk = paVar10->block;
  if (blk != (block_s *)0x0) {
    if ((ulong)blk->pos + lVar9 < 0x7ff) goto LAB_0012d980;
    block_free(blk);
  }
  blk = block_new();
  **(undefined8 **)(in_FS_OFFSET + -0x2b0) = blk;
LAB_0012d980:
  if (blk == (block_s *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    pbVar7 = (block_s *)0x0;
  }
  else {
    LOCK();
    blk->ref = blk->ref + 1;
    UNLOCK();
    uVar8 = (short)lVar9 + blk->pos;
    pbVar7 = blk + blk->pos;
    blk->pos = uVar8;
    if (0x7fd < uVar8) {
      block_free(blk);
      **(undefined8 **)(in_FS_OFFSET + -0x2b0) = 0;
    }
  }
  LOCK();
  *(undefined1 *)(*(long *)(in_FS_OFFSET + -0x2b0) + 8) = 0;
  UNLOCK();
  return pbVar7;
}

Assistant:

void *fio_malloc(size_t size) {
#if FIO_OVERRIDE_MALLOC
  if (!arenas)
    fio_mem_init();
#endif
  if (!size) {
    /* changed behavior prevents "allocation failed" test for `malloc(0)` */
    return (void *)(&on_malloc_zero);
  }
  if (size >= FIO_MEMORY_BLOCK_ALLOC_LIMIT) {
    /* system allocation - must be block aligned */
    // FIO_LOG_WARNING("fio_malloc re-routed to mmap - big allocation");
    return big_alloc(size);
  }
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  size = (size >> 4) + (!!(size & 15));
  arena_enter();
  void *mem = block_slice(size);
  arena_exit();
  return mem;
}